

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringText.cpp
# Opt level: O0

void __thiscall oout::StringText::StringText(StringText *this,string *value)

{
  string *value_local;
  StringText *this_local;
  
  Text::Text(&this->super_Text);
  (this->super_Text)._vptr_Text = (_func_int **)&PTR__StringText_00168b18;
  std::__cxx11::string::string((string *)&this->value,(string *)value);
  return;
}

Assistant:

StringText::StringText(const string &value)
	: value(value)
{
}